

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O0

void EVP_PKEY_CTX_free(EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *ctx_local;
  
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    if ((*(long *)ctx != 0) && (*(long *)(*(long *)ctx + 0x18) != 0)) {
      (**(code **)(*(long *)ctx + 0x18))(ctx);
    }
    EVP_PKEY_free(*(EVP_PKEY **)(ctx + 0x10));
    EVP_PKEY_free(*(EVP_PKEY **)(ctx + 0x18));
    OPENSSL_free(ctx);
  }
  return;
}

Assistant:

void EVP_PKEY_CTX_free(EVP_PKEY_CTX *ctx) {
  if (ctx == NULL) {
    return;
  }
  if (ctx->pmeth && ctx->pmeth->cleanup) {
    ctx->pmeth->cleanup(ctx);
  }
  EVP_PKEY_free(ctx->pkey);
  EVP_PKEY_free(ctx->peerkey);
  OPENSSL_free(ctx);
}